

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.cc
# Opt level: O0

void __thiscall
google::protobuf::File::WriteStringToFileOrDie(File *this,string_view contents,string *name)

{
  int iVar1;
  char *pcVar2;
  const_pointer __ptr;
  size_type sVar3;
  size_t t;
  LogMessage *pLVar4;
  int *piVar5;
  char *local_c0;
  byte local_b1;
  LogMessage local_b0;
  Voidify local_99;
  char *local_98;
  LogMessage local_90;
  Voidify local_79;
  unsigned_long local_78;
  unsigned_long local_70;
  Nullable<const_char_*> local_68;
  Nullable<const_char_*> absl_log_internal_check_op_result;
  byte local_41;
  LogMessage local_40;
  Voidify local_29;
  FILE *local_28;
  FILE *file;
  string *name_local;
  string_view contents_local;
  
  file = (FILE *)contents._M_str;
  contents_local._M_len = contents._M_len;
  name_local = (string *)this;
  pcVar2 = (char *)std::__cxx11::string::c_str();
  local_28 = fopen(pcVar2,"wb");
  local_41 = 0;
  if (local_28 == (FILE *)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_40,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
               ,0x67,"file != nullptr");
    local_41 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_40);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [7])"fopen(")
    ;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(string *)file);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [10])", \"wb\"): ");
    piVar5 = __errno_location();
    absl_log_internal_check_op_result = strerror(*piVar5);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>
                       (pLVar4,&absl_log_internal_check_op_result);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_29,pLVar4);
  }
  if ((local_41 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_40);
  }
  __ptr = std::basic_string_view<char,_std::char_traits<char>_>::data
                    ((basic_string_view<char,_std::char_traits<char>_> *)&name_local);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&name_local);
  t = fwrite(__ptr,1,sVar3,local_28);
  local_70 = absl::lts_20250127::log_internal::GetReferenceableValue(t);
  sVar3 = std::basic_string_view<char,_std::char_traits<char>_>::size
                    ((basic_string_view<char,_std::char_traits<char>_> *)&name_local);
  local_78 = absl::lts_20250127::log_internal::GetReferenceableValue(sVar3);
  local_68 = absl::lts_20250127::log_internal::Check_EQImpl<unsigned_long,unsigned_long>
                       (&local_70,&local_78,
                        "fwrite(contents.data(), 1, contents.size(), file) == contents.size()");
  if (local_68 != (Nullable<const_char_*>)0x0) {
    pcVar2 = absl::lts_20250127::implicit_cast<char_const*>(local_68);
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_90,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
               ,0x6a,pcVar2);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_90);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [8])"fwrite(");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(string *)file);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [4])0x70a11e)
    ;
    piVar5 = __errno_location();
    local_98 = strerror(*piVar5);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar4,&local_98);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_79,pLVar4);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_90);
  }
  iVar1 = fclose(local_28);
  local_b1 = 0;
  if (iVar1 != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_b0,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/testing/file.cc"
               ,0x6c,"fclose(file) == 0");
    local_b1 = 1;
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_b0);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<
                       (pLVar4,(char (*) [8])"fclose(");
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(string *)file);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<(pLVar4,(char (*) [4])0x70a11e)
    ;
    piVar5 = __errno_location();
    local_c0 = strerror(*piVar5);
    pLVar4 = absl::lts_20250127::log_internal::LogMessage::operator<<<char_*,_0>(pLVar4,&local_c0);
    absl::lts_20250127::log_internal::Voidify::operator&&(&local_99,pLVar4);
  }
  if ((local_b1 & 1) != 0) {
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_b0);
  }
  return;
}

Assistant:

void File::WriteStringToFileOrDie(absl::string_view contents,
                                  const std::string& name) {
  FILE* file = fopen(name.c_str(), "wb");
  ABSL_CHECK(file != nullptr)
      << "fopen(" << name << ", \"wb\"): " << strerror(errno);
  ABSL_CHECK_EQ(fwrite(contents.data(), 1, contents.size(), file),
                contents.size())
      << "fwrite(" << name << "): " << strerror(errno);
  ABSL_CHECK(fclose(file) == 0)
      << "fclose(" << name << "): " << strerror(errno);
}